

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_streaming_window.cpp
# Opt level: O1

OperatorFinalizeResultType __thiscall
duckdb::PhysicalStreamingWindow::FinalExecute
          (PhysicalStreamingWindow *this,ExecutionContext *context,DataChunk *output,
          GlobalOperatorState *gstate_p,OperatorState *state_p)

{
  DataChunk *this_00;
  _func_int **pp_Var1;
  
  if ((*(char *)&state_p[1]._vptr_OperatorState == '\x01') &&
     (state_p[0xc]._vptr_OperatorState != (_func_int **)0x0)) {
    this_00 = (DataChunk *)(state_p + 0x15);
    pp_Var1 = state_p[0x19]._vptr_OperatorState;
    DataChunk::Reset(this_00);
    state_p[0x19]._vptr_OperatorState = pp_Var1;
    if ((_func_int **)output->capacity < state_p[0x10]._vptr_OperatorState) {
      output->count = output->capacity;
      ExecuteShifted(this,context,(DataChunk *)(state_p + 0xd),this_00,output,gstate_p,state_p);
      return HAVE_MORE_OUTPUT;
    }
    ExecuteDelayed(this,context,(DataChunk *)(state_p + 0xd),this_00,output,gstate_p,state_p);
  }
  return FINISHED;
}

Assistant:

OperatorFinalizeResultType PhysicalStreamingWindow::FinalExecute(ExecutionContext &context, DataChunk &output,
                                                                 GlobalOperatorState &gstate_p,
                                                                 OperatorState &state_p) const {
	auto &state = state_p.Cast<StreamingWindowState>();

	if (state.initialized && state.lead_count) {
		auto &delayed = state.delayed;
		//	There are no more input rows
		auto &input = state.shifted;
		state.Reset(input);

		if (output.GetCapacity() < delayed.size()) {
			//	More than one output buffer was delayed, so shift in what we can
			output.SetCardinality(output.GetCapacity());
			ExecuteShifted(context, delayed, input, output, gstate_p, state_p);
			return OperatorFinalizeResultType::HAVE_MORE_OUTPUT;
		}
		ExecuteDelayed(context, delayed, input, output, gstate_p, state_p);
	}

	return OperatorFinalizeResultType::FINISHED;
}